

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayout::keepSize(QDockAreaLayout *this,QDockWidget *w)

{
  QDockAreaLayoutItem *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOf((QList<int> *)&local_38,this,&w->super_QWidget);
  if ((undefined1 *)local_38.size != (undefined1 *)0x0) {
    pQVar1 = item(this,(QList<int> *)&local_38);
    if (pQVar1->size != -1) {
      *(byte *)&pQVar1->flags = (byte)pQVar1->flags | 2;
    }
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::keepSize(QDockWidget *w)
{
    QList<int> path = indexOf(w);
    if (path.isEmpty())
        return;
    QDockAreaLayoutItem &item = this->item(path);
    if (item.size != -1)
        item.flags |= QDockAreaLayoutItem::KeepSize;
}